

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrCore.cpp
# Opt level: O3

AmrCore * __thiscall amrex::AmrCore::operator=(AmrCore *this,AmrCore *rhs)

{
  AmrMesh::operator=(&this->super_AmrMesh,&rhs->super_AmrMesh);
  return this;
}

Assistant:

AmrCore& AmrCore::operator= (AmrCore&& rhs)
{
    AmrMesh::operator=(std::move(rhs));
#ifdef AMREX_PARTICLES
    m_gdb = std::move(rhs.m_gdb);
    m_gdb->m_amrcore = this;
#endif

    return *this;
}